

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O1

void bloaty::ReadGeneralDIEAttr(uint16_t tag,AttrValue val,CU *cu,GeneralDIE *die)

{
  _Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true> *p_Var1;
  uint64_t uVar2;
  ulong uVar3;
  int iVar4;
  undefined6 in_register_0000003a;
  string_view sVar5;
  optional<unsigned_long> oVar6;
  
  iVar4 = (int)CONCAT62(in_register_0000003a,tag);
  if (iVar4 < 0x12) {
    if (iVar4 < 0x10) {
      if (iVar4 == 2) {
        if ((val.type_ & ~kUnresolvedUint) == kString) {
          sVar5 = dwarf::AttrValue::GetString(&val,cu);
          p_Var1 = &(die->location_string).
                    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
          ;
          *(size_t *)
           &(p_Var1->_M_payload).
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _M_payload = sVar5._M_len;
          *(char **)((long)&(p_Var1->_M_payload).
                            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                            ._M_payload + 8) = sVar5._M_str;
          if ((die->location_string).
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _M_engaged == false) {
            (die->location_string).
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _M_engaged = true;
          }
        }
        else if (val.form_ == 0x17) {
          uVar2 = dwarf::AttrValue::GetUint(&val,cu);
          (die->location_uint64).super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload._M_value = uVar2;
          (die->location_uint64).super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged = true;
        }
      }
      else if ((iVar4 == 3) && ((val.type_ & ~kUnresolvedUint) == kString)) {
        sVar5 = dwarf::AttrValue::GetString(&val,cu);
        p_Var1 = &(die->name).
                  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
        ;
        *(size_t *)
         &(p_Var1->_M_payload).
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _M_payload = sVar5._M_len;
        *(char **)((long)&(p_Var1->_M_payload).
                          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                          ._M_payload + 8) = sVar5._M_str;
        if ((die->name).
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _M_engaged == false) {
          (die->name).
          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _M_engaged = true;
        }
      }
    }
    else if (iVar4 == 0x10) {
      oVar6 = dwarf::AttrValue::ToUint(&val,cu);
      if (((undefined1  [16])
           oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
          (undefined1  [16])0x0) {
        (die->stmt_list).super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload._M_value =
             oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload;
        (die->stmt_list).super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged = true;
      }
    }
    else if (iVar4 == 0x11) {
      oVar6 = dwarf::AttrValue::ToUint(&val,cu);
      if (((undefined1  [16])
           oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
          (undefined1  [16])0x0) {
        (die->low_pc).super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload._M_value =
             oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload;
        (die->low_pc).super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged = true;
      }
    }
  }
  else if (iVar4 < 0x3c) {
    if (iVar4 == 0x12) {
      uVar3 = (ulong)val.form_;
      if (uVar3 < 0x2d) {
        if ((0x1e0008000002U >> (uVar3 & 0x3f) & 1) != 0) {
          uVar2 = dwarf::AttrValue::GetUint(&val,cu);
          (die->high_pc_addr).super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload._M_value = uVar2;
          (die->high_pc_addr).super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged = true;
          return;
        }
        if ((0x8e0UL >> (uVar3 & 0x3f) & 1) != 0) {
          oVar6 = dwarf::AttrValue::ToUint(&val,cu);
          (die->high_pc_size).super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload._M_value =
               oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_payload;
          (die->high_pc_size).super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged =
               oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
          return;
        }
      }
      if (0 < verbose_level) {
        fprintf(_stderr,"Unexpected form for high_pc: %d\n");
        return;
      }
    }
    else if (iVar4 == 0x2c) {
      oVar6 = dwarf::AttrValue::ToUint(&val,cu);
      if (((undefined1  [16])
           oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
          (undefined1  [16])0x0) {
        (die->start_scope).super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload._M_value =
             oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload;
        (die->start_scope).super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged = true;
      }
    }
  }
  else if (iVar4 == 0x3c) {
    oVar6 = dwarf::AttrValue::ToUint(&val,cu);
    if (((undefined1  [16])
         oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      die->declaration =
           oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload != 0;
    }
  }
  else if (iVar4 == 0x55) {
    oVar6 = dwarf::AttrValue::ToUint(&val,cu);
    if (((undefined1  [16])
         oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      if (val.form_ == 0x23) {
        (die->rnglistx).super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload._M_value =
             oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload;
        (die->rnglistx).super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged = true;
      }
      else {
        (die->ranges).super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload._M_value =
             oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload;
        (die->ranges).super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged = true;
      }
    }
  }
  return;
}

Assistant:

void ReadGeneralDIEAttr(uint16_t tag, dwarf::AttrValue val, const dwarf::CU& cu,
                        GeneralDIE* die) {
  switch (tag) {
    case DW_AT_name:
      if (val.IsString()) {
        die->name = val.GetString(cu);
      }
      break;
    case DW_AT_declaration:
      if (auto uint = val.ToUint(cu)) {
        die->declaration = *uint;
      }
      break;
    case DW_AT_location:
      if (val.IsString()) {
        die->location_string = val.GetString(cu);
      } else if (val.form() == DW_FORM_sec_offset) {
        die->location_uint64 = val.GetUint(cu);
      }
      break;
    case DW_AT_low_pc:
      if (auto uint = val.ToUint(cu)) {
        die->low_pc = *uint;
      }
      break;
    case DW_AT_high_pc:
      switch (val.form()) {
        case DW_FORM_addr:
        case DW_FORM_addrx:
        case DW_FORM_addrx1:
        case DW_FORM_addrx2:
        case DW_FORM_addrx3:
        case DW_FORM_addrx4:
          // high_pc is absolute.
          die->high_pc_addr = val.GetUint(cu);
          break;
        case DW_FORM_data1:
        case DW_FORM_data2:
        case DW_FORM_data4:
        case DW_FORM_data8:
          // high_pc is a size.
          die->high_pc_size = val.ToUint(cu);
          break;
        default:
          if (verbose_level > 0) {
            fprintf(stderr, "Unexpected form for high_pc: %d\n", val.form());
          }
          break;
      }
      break;
    case DW_AT_stmt_list:
      if (auto uint = val.ToUint(cu)) {
        die->stmt_list = *uint;
      }
      break;
    case DW_AT_ranges:
      if (auto uint = val.ToUint(cu)) {
        if (val.form() == DW_FORM_rnglistx) {
          die->rnglistx = *uint;
        } else {
          die->ranges = *uint;
        }
      }
      break;
    case DW_AT_start_scope:
      if (auto uint = val.ToUint(cu)) {
        die->start_scope = *uint;
      }
      break;
  }
}